

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

void initValue(Storage3D *ref,ElementType val,int64_t domain_size,int64_t domain_heigh)

{
  double *pdVar1;
  undefined8 local_40;
  int64_t k;
  int64_t j;
  int64_t i;
  int64_t domain_heigh_local;
  int64_t domain_size_local;
  ElementType val_local;
  Storage3D *ref_local;
  
  for (j = -halo_width; j < domain_size + halo_width; j = j + 1) {
    for (k = -halo_width; k < domain_size + halo_width; k = k + 1) {
      for (local_40 = -halo_width; local_40 < domain_height + halo_width; local_40 = local_40 + 1) {
        pdVar1 = (anonymous_namespace)::Storage<double,3ul>::operator()
                           ((Storage<double,3ul> *)ref,j,k,local_40);
        *pdVar1 = val;
      }
    }
  }
  return;
}

Assistant:

void initValue(Storage3D &ref, const ElementType val, const int64_t domain_size, const int64_t domain_heigh) {
  for (int64_t i = -halo_width; i < domain_size + halo_width; ++i)
    for (int64_t j = -halo_width; j < domain_size + halo_width; ++j)
      for (int64_t k = -halo_width; k < domain_height + halo_width; ++k) {
        ref(i, j, k) = val;
      }
}